

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O0

ExecValueAccess __thiscall
rsg::ExecutionContext::getValue(ExecutionContext *this,Variable *variable)

{
  mapped_type *ppVVar1;
  VariableType *pVVar2;
  ConstStridedValueAccess<64> CVar3;
  ValueStorage<64> *local_30;
  ExecValueStorage *storage;
  Variable *variable_local;
  ExecutionContext *this_local;
  
  storage = (ExecValueStorage *)variable;
  variable_local = (Variable *)this;
  ppVVar1 = std::
            map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
            ::operator[](&this->m_varValues,(key_type *)&storage);
  local_30 = *ppVVar1;
  if (local_30 == (mapped_type)0x0) {
    local_30 = (ValueStorage<64> *)operator_new(0x18);
    pVVar2 = rsg::Variable::getType((Variable *)storage);
    ValueStorage<64>::ValueStorage(local_30,pVVar2);
    ppVVar1 = std::
              map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
              ::operator[](&this->m_varValues,(key_type *)&storage);
    *ppVVar1 = local_30;
  }
  pVVar2 = rsg::Variable::getType((Variable *)storage);
  CVar3 = (ConstStridedValueAccess<64>)ValueStorage<64>::getValue(local_30,pVVar2);
  return (ExecValueAccess)CVar3;
}

Assistant:

ExecValueAccess ExecutionContext::getValue (const Variable* variable)
{
	ExecValueStorage* storage = m_varValues[variable];

	if (!storage)
	{
		storage = new ExecValueStorage(variable->getType());
		m_varValues[variable] = storage;
	}

	return storage->getValue(variable->getType());
}